

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

int waitForValue<int>(QPromise<int> *promise,int *initial)

{
  QPromiseBase<int> local_40;
  QPromiseBase<void> local_30;
  int local_1c;
  int *piStack_18;
  int value;
  int *initial_local;
  QPromise<int> *promise_local;
  
  local_1c = *initial;
  piStack_18 = initial;
  initial_local = (int *)promise;
  QtPromise::QPromiseBase<int>::
  then<waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::_lambda(int_const&)_1_>
            (&local_40,(anon_class_8_1_a8c68091 *)promise);
  QtPromise::QPromiseBase<void>::wait(&local_30,&local_40);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_30);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_40);
  return local_1c;
}

Assistant:

static inline T waitForValue(const QtPromise::QPromise<T>& promise, const T& initial)
{
    T value(initial);
    promise
        .then([&](const T& res) {
            value = res;
        })
        .wait();
    return value;
}